

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::generateShuffledRamp
               (int numElements,vector<int,_std::allocator<int>_> *ramp)

{
  ulong uVar1;
  pointer piVar2;
  ulong uVar3;
  Random rng;
  deRandom dStack_28;
  
  deRandom_init(&dStack_28,0xabcd);
  std::vector<int,_std::allocator<int>_>::resize(ramp,(long)numElements);
  if (0 < numElements) {
    piVar2 = (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar3 = 0;
    do {
      uVar1 = uVar3 + 1;
      piVar2[uVar3] = (int)uVar1;
      uVar3 = uVar1;
    } while ((uint)numElements != uVar1);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&dStack_28,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void generateShuffledRamp (int numElements, std::vector<int>& ramp)
{
	de::Random rng(0xabcd);

	// some positive (non-zero) unique values
	ramp.resize(numElements);
	for (int callNdx = 0; callNdx < numElements; ++callNdx)
		ramp[callNdx] = callNdx + 1;

	rng.shuffle(ramp.begin(), ramp.end());
}